

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl.c
# Opt level: O2

yajl_handle yajl_alloc(yajl_callbacks *callbacks,yajl_alloc_funcs *afs,void *ctx)

{
  size_t sVar1;
  yajl_realloc_func p_Var2;
  yajl_free_func p_Var3;
  void *pvVar4;
  yajl_handle pyVar5;
  yajl_buf pyVar6;
  uchar *puVar7;
  yajl_alloc_funcs afsBuffer;
  
  if (afs == (yajl_alloc_funcs *)0x0) {
    afs = &afsBuffer;
    yajl_set_default_alloc_funcs(afs);
  }
  else {
    afsBuffer.malloc = afs->malloc;
    if (((afsBuffer.malloc == (yajl_malloc_func)0x0) || (afs->realloc == (yajl_realloc_func)0x0)) ||
       (afs->free == (yajl_free_func)0x0)) {
      return (yajl_handle)0x0;
    }
  }
  pyVar5 = (yajl_handle)(*afsBuffer.malloc)(afs->ctx,0x78);
  p_Var2 = afs->realloc;
  p_Var3 = afs->free;
  pvVar4 = afs->ctx;
  (pyVar5->alloc).malloc = afs->malloc;
  (pyVar5->alloc).realloc = p_Var2;
  (pyVar5->alloc).free = p_Var3;
  (pyVar5->alloc).ctx = pvVar4;
  pyVar5->callbacks = callbacks;
  pyVar5->ctx = ctx;
  pyVar5->lexer = (yajl_lexer)0x0;
  pyVar5->bytesConsumed = 0;
  pyVar6 = yajl_buf_alloc(&pyVar5->alloc);
  pyVar5->decodeBuf = pyVar6;
  pyVar5->flags = 0;
  (pyVar5->stateStack).used = 0;
  (pyVar5->stateStack).stack = (uchar *)0x0;
  (pyVar5->stateStack).size = 0;
  (pyVar5->stateStack).yaf = &pyVar5->alloc;
  (pyVar5->stateStack).size = 0x80;
  puVar7 = (uchar *)(*(pyVar5->alloc).realloc)((pyVar5->alloc).ctx,(void *)0x0,0x80);
  (pyVar5->stateStack).stack = puVar7;
  sVar1 = (pyVar5->stateStack).used;
  (pyVar5->stateStack).used = sVar1 + 1;
  puVar7[sVar1] = '\0';
  return pyVar5;
}

Assistant:

yajl_handle
yajl_alloc(const yajl_callbacks * callbacks,
           yajl_alloc_funcs * afs,
           void * ctx)
{
    yajl_handle hand = NULL;
    yajl_alloc_funcs afsBuffer;

    /* first order of business is to set up memory allocation routines */
    if (afs != NULL) {
        if (afs->malloc == NULL || afs->realloc == NULL || afs->free == NULL)
        {
            return NULL;
        }
    } else {
        yajl_set_default_alloc_funcs(&afsBuffer);
        afs = &afsBuffer;
    }

    hand = (yajl_handle) YA_MALLOC(afs, sizeof(struct yajl_handle_t));

    /* copy in pointers to allocation routines */
    memcpy((void *) &(hand->alloc), (void *) afs, sizeof(yajl_alloc_funcs));

    hand->callbacks = callbacks;
    hand->ctx = ctx;
    hand->lexer = NULL; 
    hand->bytesConsumed = 0;
    hand->decodeBuf = yajl_buf_alloc(&(hand->alloc));
    hand->flags	    = 0;
    yajl_bs_init(hand->stateStack, &(hand->alloc));
    yajl_bs_push(hand->stateStack, yajl_state_start);

    return hand;
}